

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfUdpMulticast.c
# Opt level: O2

sbfUdpMulticast
sbfUdpMulticast_create(sbfUdpMulticastType type,uint32_t interf,sockaddr_in *address)

{
  undefined8 uVar1;
  socklen_t __optlen;
  in_port_t iVar2;
  in_addr iVar3;
  int iVar4;
  sbfUdpMulticast s;
  sbfPool psVar5;
  sockaddr *__optval;
  sbfSocket __fd;
  int opt;
  sockaddr local_38;
  uint local_28;
  uint32_t local_24;
  
  opt = 1;
  s = (sbfUdpMulticast)sbfMemory_calloc(1,0x30);
  s->mType = type;
  psVar5 = (sbfPool)sbfBuffer_createPool1(0x10000,"sbfUdpMulticast_create",0x15);
  s->mPool = psVar5;
  iVar2 = address->sin_port;
  iVar3.s_addr = (address->sin_addr).s_addr;
  uVar1 = *(undefined8 *)address->sin_zero;
  (s->mAddress).sin_family = address->sin_family;
  (s->mAddress).sin_port = iVar2;
  (s->mAddress).sin_addr = (in_addr)iVar3.s_addr;
  *(undefined8 *)(s->mAddress).sin_zero = uVar1;
  (s->mAddress).sin_family = 2;
  (s->mReceiveAddress).sin_family = 0;
  (s->mReceiveAddress).sin_port = 0;
  (s->mReceiveAddress).sin_addr = 0;
  (s->mReceiveAddress).sin_zero[0] = '\0';
  (s->mReceiveAddress).sin_zero[1] = '\0';
  (s->mReceiveAddress).sin_zero[2] = '\0';
  (s->mReceiveAddress).sin_zero[3] = '\0';
  (s->mReceiveAddress).sin_zero[4] = '\0';
  (s->mReceiveAddress).sin_zero[5] = '\0';
  (s->mReceiveAddress).sin_zero[6] = '\0';
  (s->mReceiveAddress).sin_zero[7] = '\0';
  iVar4 = socket(2,2,0x11);
  s->mSocket = iVar4;
  if (iVar4 < 0) goto LAB_00102cd6;
  evutil_make_socket_closeonexec(iVar4);
  evutil_make_socket_nonblocking(s->mSocket);
  if (type == SBF_UDP_MULTICAST_SEND) {
    __optval = &local_38;
    __fd = s->mSocket;
    iVar4 = 0x20;
    __optlen = 4;
    local_38._0_4_ = interf;
  }
  else {
    iVar4 = setsockopt(s->mSocket,1,2,&opt,4);
    if (iVar4 < 0) goto LAB_00102cd6;
    local_38.sa_data[6] = '\0';
    local_38.sa_data[7] = '\0';
    local_38.sa_data[8] = '\0';
    local_38.sa_data[9] = '\0';
    local_38.sa_data[10] = '\0';
    local_38.sa_data[0xb] = '\0';
    local_38.sa_data[0xc] = '\0';
    local_38.sa_data[0xd] = '\0';
    local_38.sa_data._2_4_ = (address->sin_addr).s_addr;
    local_38.sa_data._0_2_ = address->sin_port;
    local_38.sa_family = 2;
    iVar4 = bind(s->mSocket,&local_38,0x10);
    if (iVar4 < 0) goto LAB_00102cd6;
    local_28 = (address->sin_addr).s_addr;
    if ((~local_28 & 0xe0) != 0) {
      return s;
    }
    __optval = (sockaddr *)&local_28;
    __fd = s->mSocket;
    iVar4 = 0x23;
    __optlen = 8;
    local_24 = interf;
  }
  iVar4 = setsockopt(__fd,0,iVar4,__optval,__optlen);
  if (-1 < iVar4) {
    return s;
  }
LAB_00102cd6:
  sbfUdpMulticast_destroy(s);
  return (sbfUdpMulticast)0x0;
}

Assistant:

sbfUdpMulticast
sbfUdpMulticast_create (sbfUdpMulticastType type,
                        uint32_t interf,
                        struct sockaddr_in* address)
{
    sbfUdpMulticast    s;
    struct in_addr     ia;
    struct ip_mreq     im;
    struct sockaddr_in sin;
#ifdef WIN32
    char               opt = 1;
#else
    int                opt = 1;
#endif

    s = xcalloc (1, sizeof *s);
    s->mType = type;
    s->mPool = sbfBuffer_createPool (SBF_UDP_MULTICAST_SIZE_LIMIT);

    memcpy (&s->mAddress, address, sizeof s->mAddress);
    s->mAddress.sin_family = AF_INET;

    memset (&s->mReceiveAddress, 0x0, sizeof s->mReceiveAddress);

    s->mSocket = socket (AF_INET, SOCK_DGRAM, IPPROTO_UDP);
    if (s->mSocket < 0)
        goto fail;
    evutil_make_socket_closeonexec (s->mSocket);
    evutil_make_socket_nonblocking (s->mSocket);

    if (type == SBF_UDP_MULTICAST_SEND)
    {
        memset (&ia, 0, sizeof ia);
        ia.s_addr = interf;
        if (setsockopt (s->mSocket,
                        IPPROTO_IP,
                        IP_MULTICAST_IF,
                        (void*)&ia,
                        sizeof ia) < 0)
            goto fail;
    }
    else
    {
        if (setsockopt (s->mSocket,
                        SOL_SOCKET,
                        SO_REUSEADDR,
                        &opt,
                        sizeof opt) < 0)
            goto fail;

        memset (&sin, 0, sizeof sin);
        sin.sin_family = AF_INET;
#ifdef WIN32
        sin.sin_addr.s_addr = INADDR_ANY;
#else
        sin.sin_addr.s_addr = address->sin_addr.s_addr;
#endif
        sin.sin_port = address->sin_port;
        if (bind (s->mSocket, (struct sockaddr*)&sin, sizeof sin) < 0)
            goto fail;

        if ((address->sin_addr.s_addr & 0xFF) >= 224)
        {
            memset (&im, 0, sizeof im);
            im.imr_multiaddr.s_addr = address->sin_addr.s_addr;
            im.imr_interface.s_addr = interf;
            if (setsockopt (s->mSocket,
                            IPPROTO_IP,
                            IP_ADD_MEMBERSHIP,
                            (void*)&im,
                            sizeof im) < 0)
                goto fail; 
        }
    }

    return s;

fail:
    sbfUdpMulticast_destroy (s);
    return NULL;
}